

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::VariablesFbLoadForces(ChMatterSPH *this,double factor)

{
  ChSystem *pCVar1;
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  pointer psVar4;
  element_type *peVar5;
  undefined8 uVar6;
  element_type *peVar7;
  uint uVar8;
  ulong uVar9;
  __shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  double dVar11;
  double dVar12;
  double dVar13;
  shared_ptr<chrono::ChProximityContainerSPH> edges;
  shared_ptr<chrono::ChNodeSPH> mnode_1;
  ChVector<double> v;
  shared_ptr<chrono::ChPhysicsItem> otherphysics;
  __shared_ptr<chrono::ChProximityContainerSPH,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2> local_c0;
  double local_b0;
  __shared_ptr<chrono::ChProximityContainerSPH,_(__gnu_cxx::_Lock_policy)2> local_a8;
  double local_98;
  undefined1 local_88 [48];
  __shared_ptr<chrono::ChProximityContainerSPH,_(__gnu_cxx::_Lock_policy)2> *local_58 [2];
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> local_48 [24];
  
  local_d8._M_ptr = (ChProximityContainerSPH *)0x0;
  local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  p_Var10 = &((pCVar1->assembly).otherphysicslist.
              super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((pCVar1->assembly).otherphysicslist.
             super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
  local_b0 = factor;
  do {
    if (p_Var10 == p_Var2) break;
    std::__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *)local_88,p_Var10);
    std::dynamic_pointer_cast<chrono::ChProximityContainerSPH,chrono::ChPhysicsItem>
              ((shared_ptr<chrono::ChPhysicsItem> *)&local_a8);
    std::__shared_ptr<chrono::ChProximityContainerSPH,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_d8,&local_a8);
    peVar7 = local_d8._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    p_Var10 = p_Var10 + 1;
  } while (peVar7 == (ChProximityContainerSPH *)0x0);
  dVar11 = DAT_011dd3e8;
  dVar13 = DAT_011dd3e0;
  uVar6 = VNULL;
  if (local_d8._M_ptr == (ChProximityContainerSPH *)0x0) {
    __assert_fail("edges",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                  ,0x1e5,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
  }
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar8 = 0; (ulong)uVar8 < (ulong)((long)psVar4 - (long)psVar3 >> 4); uVar8 = uVar8 + 1) {
    peVar5 = psVar3[uVar8].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 != (element_type *)Q_ROTATE_X_TO_Z) {
      (peVar5->UserForce).m_data[0] = (double)uVar6;
      (peVar5->UserForce).m_data[1] = dVar13;
      (peVar5->UserForce).m_data[2] = dVar11;
    }
    peVar5->density = 0.0;
  }
  ChProximityContainerSPH::AccumulateStep1(local_d8._M_ptr);
  uVar8 = 0;
  while( true ) {
    psVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <=
        (ulong)uVar8) {
      ChProximityContainerSPH::AccumulateStep2(local_d8._M_ptr);
      uVar8 = 0;
      while( true ) {
        psVar3 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = (ulong)uVar8;
        if ((ulong)((long)(this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar9)
        {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
          return;
        }
        pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
        dVar13 = (double)(**(code **)(*(long *)&(psVar3[uVar9].
                                                 super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->super_ChNodeXYZ + 0x90))();
        psVar3 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar5 = psVar3[uVar9].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_a8._M_ptr =
             (element_type *)(dVar13 * (pCVar1->G_acc).m_data[0] + (peVar5->UserForce).m_data[0]);
        local_a8._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (dVar13 * (pCVar1->G_acc).m_data[1] + (peVar5->UserForce).m_data[1]);
        local_98 = dVar13 * (pCVar1->G_acc).m_data[2] + (peVar5->UserForce).m_data[2];
        std::__shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,
                   &psVar3[uVar9].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)
        ;
        if (local_c0._M_ptr == (element_type *)0x0) break;
        local_58[0] = &local_a8;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)local_88,&local_b0,(StorageBaseType *)local_58);
        ChVariables::Get_fb((ChVectorRef *)local_48,
                            &((local_c0._M_ptr)->variables).super_ChVariables);
        Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
        operator+=(local_48,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        uVar8 = uVar8 + 1;
      }
      __assert_fail("mnode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                    ,0x214,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
    }
    std::__shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2> *)local_88,
               &psVar3[uVar8].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>);
    if ((element_type *)local_88._0_8_ == (element_type *)0x0) break;
    dVar13 = *(double *)(local_88._0_8_ + 0xe8);
    dVar12 = 0.0;
    dVar11 = 0.0;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      (**(_func_int **)((long)((ChNodeXYZ *)local_88._0_8_)->super_ChLoadableUVW + 0x90))();
      dVar13 = *(double *)(local_88._0_8_ + 0xe8);
      dVar12 = dVar11 / dVar13;
    }
    *(double *)(local_88._0_8_ + 0xe0) = dVar12;
    *(double *)(local_88._0_8_ + 0x100) =
         (dVar13 - (this->material).super_ChContinuumMaterial.density) *
         (this->material).pressure_stiffness;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    uVar8 = uVar8 + 1;
  }
  __assert_fail("mnode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                ,0x1f8,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
}

Assistant:

void ChMatterSPH::VariablesFbLoadForces(double factor) {
    // COMPUTE THE SPH FORCES HERE

    // First, find if any ChProximityContainerSPH object is present in the system

    std::shared_ptr<ChProximityContainerSPH> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerSPH>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterSPH, you must add also a ChProximityContainerSPH.
    if (!edges)
        return;

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of particles's density

    edges->AccumulateStep1();

    // 3- Per-node volume and pressure computation

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // node pressure = k(dens - dens_0);
        mnode->pressure = material.Get_pressure_stiffness() * (mnode->density - material.Get_density());
    }

    // 4- Per-edge forces computation and accumulation

    edges->AccumulateStep2();

    // 5- Per-node load forces

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        // downcast
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        mnode->variables.Get_fb() += factor * TotForce.eigen();
    }
}